

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

void __thiscall
MeCab::anon_unknown_0::LatticeImpl::set_sentence(LatticeImpl *this,char *sentence,size_t len)

{
  ulong uVar1;
  Allocator<mecab_node_t,_mecab_path_t> *this_00;
  char *pcVar2;
  reference ppmVar3;
  long in_RDX;
  char *in_RSI;
  long *in_RDI;
  vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *unaff_retaddr;
  char *new_sentence;
  long *__new_size;
  
  __new_size = in_RDI;
  (**(code **)*in_RDI)();
  std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::resize
            (unaff_retaddr,(size_type)__new_size);
  std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::resize
            (unaff_retaddr,(size_type)__new_size);
  uVar1 = (**(code **)(*in_RDI + 0x90))(in_RDI,0x40);
  if ((uVar1 & 1) == 0) {
    uVar1 = (**(code **)(*in_RDI + 0x90))(in_RDI,4);
    if ((uVar1 & 1) == 0) {
      in_RDI[1] = (long)in_RSI;
      goto LAB_001a2bee;
    }
  }
  this_00 = (Allocator<mecab_node_t,_mecab_path_t> *)(**(code **)(*in_RDI + 0xb0))();
  pcVar2 = Allocator<mecab_node_t,_mecab_path_t>::strdup(this_00,in_RSI);
  in_RDI[1] = (long)pcVar2;
LAB_001a2bee:
  in_RDI[2] = in_RDX;
  ppmVar3 = std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::operator[]
                      ((vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *)(in_RDI + 10),0);
  memset(ppmVar3,0,(in_RDX + 4) * 8);
  ppmVar3 = std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::operator[]
                      ((vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *)(in_RDI + 0xd),0);
  memset(ppmVar3,0,(in_RDX + 4) * 8);
  return;
}

Assistant:

void LatticeImpl::set_sentence(const char *sentence, size_t len) {
  clear();
  end_nodes_.resize(len + 4);
  begin_nodes_.resize(len + 4);

  if (has_request_type(MECAB_ALLOCATE_SENTENCE) ||
      has_request_type(MECAB_PARTIAL)) {
    char *new_sentence = allocator()->strdup(sentence, len);
    sentence_ = new_sentence;
  } else {
    sentence_ = sentence;
  }

  size_ = len;
  std::memset(&end_nodes_[0],   0,
              sizeof(end_nodes_[0]) * (len + 4));
  std::memset(&begin_nodes_[0], 0,
              sizeof(begin_nodes_[0]) * (len + 4));
}